

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_lzma.c
# Opt level: O0

void test_compat_lzma(void)

{
  compat_lzma("test_compat_lzma_1.tlz");
  compat_lzma("test_compat_lzma_2.tlz");
  compat_lzma("test_compat_lzma_3.tlz");
  return;
}

Assistant:

DEFINE_TEST(test_compat_lzma)
{
	/* This sample has been added junk data to its tail. */
	compat_lzma("test_compat_lzma_1.tlz");
	/* This sample has been made by lzma with option -e,
	 * the first byte of which is 0x5e.
	 * Not supported in libarchive 2.7.* and earlier */
	compat_lzma("test_compat_lzma_2.tlz");
	/* This sample has been made by lzma of LZMA SDK with
	 * option -d12, second byte and third byte of which is
	 * not zero.
	 * Not supported in libarchive 2.7.* and earlier */
	compat_lzma("test_compat_lzma_3.tlz");
}